

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_tools.h
# Opt level: O1

void __thiscall
ncnn::SafeOrderList<ncnn::ObjectBox>::insert(SafeOrderList<ncnn::ObjectBox> *this,ObjectBox *value)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  int iVar3;
  _List_node_base *p_Var4;
  SafeOrderList<ncnn::ObjectBox> *pSVar5;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  pSVar5 = this;
  do {
    pSVar5 = (SafeOrderList<ncnn::ObjectBox> *)
             (pSVar5->container).super__List_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (pSVar5 == this) break;
    iVar3 = (*this->condition)(value,(ObjectBox *)
                                     &(pSVar5->container).
                                      super__List_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>
                                      ._M_impl._M_node._M_size);
  } while (iVar3 < 1);
  p_Var4 = (_List_node_base *)operator_new(0x28);
  p_Var4[2]._M_next = *(_List_node_base **)&value->prob;
  p_Var2 = *(_List_node_base **)&value->xmax;
  p_Var4[1]._M_next = *(_List_node_base **)value;
  p_Var4[1]._M_prev = p_Var2;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(this->container).super__List_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return;
}

Assistant:

void insert(const T &value)
  {
    MutexLockGuard guard(mutex);
    Iterator iter = container.begin();
    for (; iter != container.end(); iter++)
    {
      if (condition(value, *iter) > 0)
        break;
    }
    container.insert(iter, value);
  }